

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O3

void __thiscall
vkt::Draw::anon_unknown_0::DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndirectParams>::
generateDrawData(DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndirectParams> *this)

{
  pointer pPVar1;
  pointer pPVar2;
  size_type __n;
  long lVar3;
  pointer pVVar4;
  uint uVar5;
  ulong uVar6;
  pointer pVVar7;
  float fVar8;
  Random rnd;
  undefined8 uStack_d0;
  undefined1 local_c8 [8];
  pointer pPStack_c0;
  pointer local_b8;
  float local_a8;
  float local_98 [4];
  float local_88;
  float local_78;
  deRandom local_68;
  value_type local_58;
  
  pVVar7 = (this->m_data).commands.
           super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uStack_d0 = 0x6e032e;
  deRandom_init(&local_68,pVVar7->vertexCount ^ pVVar7->firstVertex ^ 0xc2a39f);
  __n = 0;
  for (pVVar7 = (this->m_data).commands.
                super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pVVar7 != (this->m_data).commands.
                super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
                ._M_impl.super__Vector_impl_data._M_finish; pVVar7 = pVVar7 + 1) {
    uVar5 = pVVar7->vertexCount + pVVar7->firstVertex;
    uVar6 = (ulong)uVar5;
    if (uVar5 <= (uint)__n) {
      uVar6 = __n;
    }
    __n = uVar6;
  }
  local_58.color.m_data[0] = 0.0;
  local_58.color.m_data[1] = 0.0;
  local_58.color.m_data[2] = 0.0;
  local_58.color.m_data[3] = 0.0;
  local_58.position.m_data[0] = 0.0;
  local_58.position.m_data[1] = 0.0;
  local_58.position.m_data[2] = 0.0;
  local_58.position.m_data[3] = 0.0;
  uStack_d0 = 0x6e0379;
  std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>::
  vector((vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_> *)
         local_c8,__n,&local_58,(allocator_type *)local_98);
  pPVar1 = (this->m_data).super_DrawParamsBase.vertices.
           super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar2 = (this->m_data).super_DrawParamsBase.vertices.
           super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_data).super_DrawParamsBase.vertices.
  super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_c8;
  (this->m_data).super_DrawParamsBase.vertices.
  super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
  ._M_impl.super__Vector_impl_data._M_finish = pPStack_c0;
  (this->m_data).super_DrawParamsBase.vertices.
  super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_b8;
  local_c8 = (undefined1  [8])0x0;
  pPStack_c0 = (pointer)0x0;
  local_b8 = (pointer)0x0;
  if (pPVar1 != (pointer)0x0) {
    uStack_d0 = 0x6e03b9;
    operator_delete(pPVar1,(long)pPVar2 - (long)pPVar1);
    if (local_c8 != (undefined1  [8])0x0) {
      uStack_d0 = 0x6e03cf;
      operator_delete((void *)local_c8,(long)local_b8 - (long)local_c8);
    }
  }
  pVVar7 = (this->m_data).commands.
           super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pVVar4 = (this->m_data).commands.
           super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pVVar7 != pVVar4) {
    do {
      if (pVVar7->vertexCount != 0) {
        uVar5 = pVVar7->firstVertex;
        pPVar1 = (this->m_data).super_DrawParamsBase.vertices.
                 super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar6 = 0;
        do {
          local_58.position.m_data[2] = 0.0;
          local_58.position.m_data[3] = 1.4013e-45;
          local_58.color.m_data[0] = 2.8026e-45;
          local_58.color.m_data[1] = 4.2039e-45;
          uStack_d0 = 0x6e0425;
          local_a8 = deRandom_getFloat(&local_68);
          uStack_d0 = 0x6e0432;
          fVar8 = deRandom_getFloat(&local_68);
          local_c8._4_4_ = fVar8 + fVar8 + -1.0;
          local_c8._0_4_ = local_a8 + local_a8 + -1.0;
          pPStack_c0 = (pointer)0x3f8000003f800000;
          lVar3 = 2;
          do {
            *(undefined4 *)
             ((long)(pPVar1 + uVar5 + uVar6) + (long)(int)local_58.position.m_data[lVar3] * 4) =
                 *(undefined4 *)((long)&uStack_d0 + lVar3 * 4);
            lVar3 = lVar3 + 1;
          } while (lVar3 != 6);
          pPStack_c0 = (pointer)0x100000000;
          local_b8 = (pointer)0x300000002;
          uStack_d0 = 0x6e0483;
          local_a8 = deRandom_getFloat(&local_68);
          uStack_d0 = 0x6e0490;
          local_78 = deRandom_getFloat(&local_68);
          uStack_d0 = 0x6e049d;
          local_88 = deRandom_getFloat(&local_68);
          uStack_d0 = 0x6e04aa;
          fVar8 = deRandom_getFloat(&local_68);
          local_98[0] = local_a8 + 0.0;
          local_98[1] = local_78 + 0.0;
          local_98[2] = local_88 + 0.0;
          local_98[3] = fVar8 + 0.0;
          lVar3 = 2;
          do {
            *(float *)((long)(pPVar1 + uVar5 + uVar6) + 0x10U +
                      (long)*(int *)(local_c8 + lVar3 * 4) * 4) = local_98[lVar3 + -2];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 6);
          uVar6 = uVar6 + 1;
        } while (uVar6 < pVVar7->vertexCount);
        pVVar4 = (this->m_data).commands.
                 super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      pVVar7 = pVVar7 + 1;
    } while (pVVar7 != pVVar4);
  }
  return;
}

Assistant:

void DrawTestInstance<DrawIndirectParams>::generateDrawData (void)
{
	de::Random	rnd(SEED ^ m_data.commands[0].vertexCount ^ m_data.commands[0].firstVertex);

	deUint32 lastIndex	= 0;

	// Find the interval which will be used
	for (std::vector<vk::VkDrawIndirectCommand>::const_iterator it = m_data.commands.begin(); it != m_data.commands.end(); ++it)
	{
		const deUint32	index = it->firstVertex + it->vertexCount;
		lastIndex	= (index > lastIndex) ? index : lastIndex;
	}

	// Initialize with zeros
	m_data.vertices = std::vector<PositionColorVertex>(lastIndex, PositionColorVertex(tcu::Vec4(0.0, 0.0, 0.0, 0.0), tcu::Vec4(0.0, 0.0, 0.0, 0.0)));

	// Generate random vertices only where necessary
	for (std::vector<vk::VkDrawIndirectCommand>::const_iterator it = m_data.commands.begin(); it != m_data.commands.end(); ++it)
	{
		std::vector<PositionColorVertex>::iterator vertexStart = m_data.vertices.begin() + it->firstVertex;

		for (deUint32 idx = 0; idx < it->vertexCount; ++idx)
		{
			std::vector<PositionColorVertex>::iterator vertexIt = vertexStart + idx;

			tcu::VecAccess<float, 4, 4> positionAccess = vertexIt->position.xyzw();
			positionAccess = tcu::Vec4(rnd.getFloat(-1.0, 1.0), rnd.getFloat(-1.0, 1.0), 1.0, 1.0);

			tcu::VecAccess<float, 4, 4> colorAccess = vertexIt->color.xyzw();
			colorAccess = tcu::Vec4(rnd.getFloat(0.0, 1.0), rnd.getFloat(0.0, 1.0), rnd.getFloat(0.0, 1.0), rnd.getFloat(0.0, 1.0));
		}
	}
}